

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O2

void __thiscall
btQuantizedBvh::setQuantizationValues
          (btQuantizedBvh *this,btVector3 *bvhAabbMin,btVector3 *bvhAabbMax,
          btScalar quantizationMargin)

{
  btVector3 *v2;
  btVector3 *v1;
  undefined1 auVar1 [16];
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  btVector3 bVar5;
  unsigned_short vecIn [3];
  btVector3 local_50;
  btVector3 clampValue;
  
  clampValue.m_floats[3] = 0.0;
  clampValue.m_floats[0] = quantizationMargin;
  clampValue.m_floats[1] = quantizationMargin;
  clampValue.m_floats[2] = quantizationMargin;
  bVar5 = operator-(bvhAabbMin,&clampValue);
  v2 = &this->m_bvhAabbMin;
  *&(this->m_bvhAabbMin).m_floats = bVar5.m_floats;
  bVar5 = operator+(bvhAabbMax,&clampValue);
  v1 = &this->m_bvhAabbMax;
  *&(this->m_bvhAabbMax).m_floats = bVar5.m_floats;
  bVar5 = operator-(v1,v2);
  auVar2._8_4_ = extraout_XMM0_Dc;
  auVar2._0_8_ = bVar5.m_floats._0_8_;
  auVar2._12_4_ = extraout_XMM0_Dd;
  auVar2 = divps(_DAT_001afc80,auVar2);
  auVar3._0_8_ = auVar2._0_8_;
  auVar3._8_4_ = 65533.0 / bVar5.m_floats[2];
  auVar3._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_bvhQuantization).m_floats = auVar3;
  this->m_useQuantization = true;
  quantize(this,vecIn,v2,0);
  bVar5 = unQuantize(this,vecIn);
  local_50.m_floats[1] = bVar5.m_floats[1] - clampValue.m_floats[1];
  local_50.m_floats[0] = bVar5.m_floats[0] - clampValue.m_floats[0];
  local_50.m_floats[2] = bVar5.m_floats[2] - clampValue.m_floats[2];
  local_50.m_floats[3] = 0.0;
  btVector3::setMin(v2,&local_50);
  quantize(this,vecIn,v1,1);
  bVar5 = unQuantize(this,vecIn);
  local_50.m_floats[0] = clampValue.m_floats[0] + bVar5.m_floats[0];
  local_50.m_floats[1] = clampValue.m_floats[1] + bVar5.m_floats[1];
  local_50.m_floats[2] = bVar5.m_floats[2] + clampValue.m_floats[2];
  local_50.m_floats[3] = 0.0;
  btVector3::setMax(v1,&local_50);
  bVar5 = operator-(v1,v2);
  auVar1._8_4_ = extraout_XMM0_Dc_00;
  auVar1._0_8_ = bVar5.m_floats._0_8_;
  auVar1._12_4_ = extraout_XMM0_Dd_00;
  auVar2 = divps(_DAT_001afc80,auVar1);
  auVar4._0_8_ = auVar2._0_8_;
  auVar4._8_4_ = 65533.0 / bVar5.m_floats[2];
  auVar4._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_bvhQuantization).m_floats = auVar4;
  return;
}

Assistant:

void	btQuantizedBvh::setQuantizationValues(const btVector3& bvhAabbMin,const btVector3& bvhAabbMax,btScalar quantizationMargin)
{
	//enlarge the AABB to avoid division by zero when initializing the quantization values
	btVector3 clampValue(quantizationMargin,quantizationMargin,quantizationMargin);
	m_bvhAabbMin = bvhAabbMin - clampValue;
	m_bvhAabbMax = bvhAabbMax + clampValue;
	btVector3 aabbSize = m_bvhAabbMax - m_bvhAabbMin;
	m_bvhQuantization = btVector3(btScalar(65533.0),btScalar(65533.0),btScalar(65533.0)) / aabbSize;

	m_useQuantization = true;

	{
		unsigned short vecIn[3];
		btVector3 v;
		{
			quantize(vecIn,m_bvhAabbMin,false);
			v = unQuantize(vecIn);
			m_bvhAabbMin.setMin(v-clampValue);
		}
		{
			quantize(vecIn,m_bvhAabbMax,true);
			v = unQuantize(vecIn);
			m_bvhAabbMax.setMax(v+clampValue);
		}
		aabbSize = m_bvhAabbMax - m_bvhAabbMin;
		m_bvhQuantization = btVector3(btScalar(65533.0),btScalar(65533.0),btScalar(65533.0)) / aabbSize;
	}
}